

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int https_checkfile(char *urltype,char *infile,char *outfile1)

{
  int iVar1;
  size_t sVar2;
  char *outfile1_local;
  char *infile_local;
  char *urltype_local;
  
  strcpy(urltype,"https://");
  sVar2 = strlen(outfile1);
  if (sVar2 != 0) {
    iVar1 = strncmp(outfile1,"file://",7);
    if (iVar1 == 0) {
      strcpy(netoutfile,outfile1 + 7);
    }
    else {
      strcpy(netoutfile,outfile1);
    }
    iVar1 = strncmp(outfile1,"mem:",4);
    if (iVar1 == 0) {
      strcpy(urltype,"httpsmem://");
    }
    else {
      strcpy(urltype,"httpsfile://");
    }
  }
  return 0;
}

Assistant:

int https_checkfile (char *urltype, char *infile, char *outfile1)
{
  /* set default  */
  strcpy(urltype,"https://");
  
  if (strlen(outfile1))
  {
    /* don't copy the "file://" prefix, if present.  */
    if (!strncmp(outfile1, "file://", 7) ) {
      strcpy(netoutfile,outfile1+7);
    } else {
      strcpy(netoutfile,outfile1);
    }
    
    if (!strncmp(outfile1, "mem:", 4))
       strcpy(urltype,"httpsmem://");
    else       
       strcpy(urltype,"httpsfile://");
  }

   return 0;
}